

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O2

void write_unsigned<unsigned_long>
               (raw_ostream *S,unsigned_long N,size_t MinDigits,IntegerStyle Style,bool IsNegative)

{
  bool bVar1;
  byte *pbVar2;
  size_t __n;
  size_t I;
  void *pvVar3;
  long lVar4;
  void *__buf;
  ArrayRef<char> Buffer;
  char acStack_40 [16];
  
  if (N >> 0x20 != 0) {
    builtin_strncpy(acStack_40,"00000000",8);
    pbVar2 = (byte *)(acStack_40 + 7);
    lVar4 = 0;
    do {
      *pbVar2 = (byte)(N % 10) | 0x30;
      lVar4 = lVar4 + 0x100000000;
      pbVar2 = pbVar2 + -1;
      bVar1 = 9 < N;
      N = N / 10;
    } while (bVar1);
    __buf = (void *)(lVar4 >> 0x20);
    if (IsNegative) {
      llvm::raw_ostream::operator<<(S,'-');
    }
    __n = CONCAT71((int7)((ulong)pbVar2 >> 8),Style == Number || MinDigits <= __buf);
    pvVar3 = __buf;
    if (Style != Number && MinDigits > __buf) {
      for (; pvVar3 < MinDigits; pvVar3 = (void *)((long)pvVar3 + 1)) {
        llvm::raw_ostream::operator<<(S,'0');
      }
    }
    if (Style == Number) {
      Buffer.Length = (size_type)__buf;
      Buffer.Data = acStack_40 + (8 - (long)__buf);
      writeWithCommas(S,Buffer);
    }
    else {
      llvm::raw_ostream::write(S,(int)(acStack_40 + (8 - (long)__buf)),__buf,__n);
    }
    return;
  }
  write_unsigned_impl<unsigned_int>(S,(uint)N,MinDigits,Style,IsNegative);
  return;
}

Assistant:

static void write_unsigned(raw_ostream &S, T N, size_t MinDigits,
                           IntegerStyle Style, bool IsNegative = false) {
  // Output using 32-bit div/mod if possible.
  if (N == static_cast<uint32_t>(N))
    write_unsigned_impl(S, static_cast<uint32_t>(N), MinDigits, Style,
                        IsNegative);
  else
    write_unsigned_impl(S, N, MinDigits, Style, IsNegative);
}